

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O2

int char2hex(char c)

{
  undefined3 in_register_00000039;
  
  if ((byte)(c - 0x30U) < 10) {
    return CONCAT31(in_register_00000039,c) + -0x30;
  }
  if ((byte)(c + 0xbfU) < 6) {
    return CONCAT31(in_register_00000039,c) + -0x37;
  }
  return ~(uint)(c == '.');
}

Assistant:

static inline int char2hex(char c)
{
    if (c >= '0' && c <= '9')
        return c - '0';
    if (c >= 'A' && c <= 'F')
        return c - 'A' + 10;
    if (c == '.')
        return -2;
    return -1;
}